

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

off_t unztell(unzFile file)

{
  off_t oVar1;
  
  oVar1 = -0x66;
  if ((file != (unzFile)0x0) && (*(long *)((long)file + 0x140) != 0)) {
    oVar1 = *(off_t *)(*(long *)((long)file + 0x140) + 0x30);
  }
  return oVar1;
}

Assistant:

extern z_off_t ZEXPORT unztell(unzFile file)
{
    unz64_s* s;
    file_in_zip64_read_info_s* pfile_in_zip_read_info;
    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    pfile_in_zip_read_info = s->pfile_in_zip_read;

    if (pfile_in_zip_read_info == NULL)
        return UNZ_PARAMERROR;

    return (z_off_t)pfile_in_zip_read_info->stream.total_out;
}